

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  int a;
  undefined8 *puVar3;
  stbi__uint32 b;
  stbi__context *s;
  byte *pbVar4;
  stbi_uc sVar5;
  uint uVar6;
  stbi__uint32 sVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  stbi_uc *psVar11;
  void *pvVar12;
  stbi_uc *psVar13;
  byte bVar14;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  ulong uVar15;
  int iVar16;
  stbi_uc **ppsVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  int *piVar21;
  int b_00;
  long lVar22;
  
  s = z->s;
  uVar6 = stbi__get16be(s);
  if (uVar6 < 0xb) {
LAB_001d269b:
    stbi__g_failure_reason = "bad SOF len";
  }
  else {
    psVar11 = s->img_buffer;
    if (psVar11 < s->img_buffer_end) {
      s->img_buffer = psVar11 + 1;
      sVar5 = *psVar11;
LAB_001d271c:
      if (sVar5 == '\b') {
        sVar7 = stbi__get16be(s);
        s->img_y = sVar7;
        if (sVar7 == 0) {
          stbi__g_failure_reason = "no header height";
          return 0;
        }
        sVar7 = stbi__get16be(s);
        s->img_x = sVar7;
        if (sVar7 == 0) {
          stbi__g_failure_reason = "0 width";
          return 0;
        }
        pbVar4 = s->img_buffer;
        psVar11 = s->img_buffer_end;
        if (pbVar4 < psVar11) {
          psVar13 = pbVar4 + 1;
          s->img_buffer = psVar13;
          bVar14 = *pbVar4;
        }
        else {
          if (s->read_from_callbacks == 0) goto LAB_001d2c4d;
          psVar13 = s->buffer_start;
          iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar13,s->buflen);
          if (iVar10 == 0) {
            s->read_from_callbacks = 0;
            psVar11 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            bVar14 = 0;
          }
          else {
            psVar11 = psVar13 + iVar10;
            bVar14 = *psVar13;
          }
          s->img_buffer_end = psVar11;
          psVar13 = s->buffer_start + 1;
          s->img_buffer = psVar13;
        }
        if (4 < bVar14) {
LAB_001d2c4d:
          stbi__g_failure_reason = "bad component count";
          return 0;
        }
        uVar19 = (ulong)bVar14;
        if ((0x1aU >> (bVar14 & 0x1f) & 1) == 0) goto LAB_001d2c4d;
        s->img_n = (uint)bVar14;
        ppsVar17 = &z->img_comp[0].data;
        uVar15 = uVar19;
        do {
          *ppsVar17 = (stbi_uc *)0x0;
          ppsVar17[3] = (stbi_uc *)0x0;
          ppsVar17 = ppsVar17 + 0xc;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
        if (uVar6 == (uint)bVar14 + (uint)bVar14 * 2 + 8) {
          z->rgb = 0;
          psVar1 = s->buffer_start;
          psVar2 = s->buffer_start + 1;
          piVar21 = &z->img_comp[0].tq;
          lVar22 = 0;
          do {
            iVar10 = (int)uVar19;
            if (psVar13 < psVar11) {
              s->img_buffer = psVar13 + 1;
              bVar14 = *psVar13;
              psVar13 = psVar13 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              bVar14 = 0;
            }
            else {
              iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
              if (iVar10 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar14 = 0;
                psVar11 = psVar2;
              }
              else {
                bVar14 = *psVar1;
                psVar11 = psVar1 + iVar10;
              }
              s->img_buffer_end = psVar11;
              s->img_buffer = psVar2;
              iVar10 = s->img_n;
              psVar13 = psVar2;
            }
            ((anon_struct_96_18_0d0905d3 *)(piVar21 + -3))->id = (uint)bVar14;
            if ((iVar10 == 3) && (bVar14 == "RGB"[lVar22])) {
              z->rgb = z->rgb + 1;
            }
            if (psVar13 < psVar11) {
              s->img_buffer = psVar13 + 1;
              bVar14 = *psVar13;
              psVar13 = psVar13 + 1;
            }
            else {
              if (s->read_from_callbacks == 0) {
                piVar21[-2] = 0;
                goto LAB_001d2c70;
              }
              iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
              if (iVar10 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar14 = 0;
                psVar11 = psVar2;
              }
              else {
                bVar14 = *psVar1;
                psVar11 = psVar1 + iVar10;
              }
              s->img_buffer_end = psVar11;
              s->img_buffer = psVar2;
              psVar13 = psVar2;
            }
            piVar21[-2] = (uint)(bVar14 >> 4);
            if ((byte)(bVar14 + 0xb0) < 0xc0) {
LAB_001d2c70:
              stbi__g_failure_reason = "bad H";
              return 0;
            }
            piVar21[-1] = bVar14 & 0xf;
            if ((bVar14 & 0xf) - 5 < 0xfffffffc) {
              stbi__g_failure_reason = "bad V";
              return 0;
            }
            if (psVar13 < psVar11) {
              s->img_buffer = psVar13 + 1;
              bVar14 = *psVar13;
              psVar13 = psVar13 + 1;
LAB_001d29ea:
              *piVar21 = (uint)bVar14;
              if (3 < bVar14) {
                stbi__g_failure_reason = "bad TQ";
                return 0;
              }
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                if (iVar10 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar14 = 0;
                  psVar11 = psVar2;
                }
                else {
                  bVar14 = *psVar1;
                  psVar11 = psVar1 + iVar10;
                }
                s->img_buffer_end = psVar11;
                s->img_buffer = psVar2;
                psVar13 = psVar2;
                goto LAB_001d29ea;
              }
              *piVar21 = 0;
            }
            lVar22 = lVar22 + 1;
            iVar10 = s->img_n;
            uVar19 = (ulong)iVar10;
            piVar21 = piVar21 + 0x18;
          } while (lVar22 < (long)uVar19);
          if (scan != 0) {
            return 1;
          }
          sVar7 = s->img_x;
          b = s->img_y;
          iVar8 = stbi__mad3sizes_valid(sVar7,b,iVar10,0);
          if (iVar8 == 0) {
            stbi__g_failure_reason = "too large";
            return 0;
          }
          uVar6 = 1;
          uVar15 = 1;
          if (0 < iVar10) {
            uVar15 = 1;
            lVar22 = 0;
            uVar6 = 1;
            do {
              uVar9 = *(uint *)((long)&z->img_comp[0].h + lVar22);
              uVar18 = *(uint *)((long)&z->img_comp[0].v + lVar22);
              if ((int)uVar6 < (int)uVar9) {
                uVar6 = uVar9;
              }
              if ((int)uVar15 < (int)uVar18) {
                uVar15 = (ulong)uVar18;
              }
              lVar22 = lVar22 + 0x60;
            } while (uVar19 * 0x60 != lVar22);
          }
          iVar8 = (int)uVar15;
          uVar18 = ((sVar7 + uVar6 * 8) - 1) / (uVar6 * 8);
          uVar9 = ((b + iVar8 * 8) - 1) / (uint)(iVar8 * 8);
          z->img_h_max = uVar6;
          z->img_v_max = iVar8;
          z->img_mcu_w = uVar6 * 8;
          z->img_mcu_h = iVar8 * 8;
          z->img_mcu_x = uVar18;
          z->img_mcu_y = uVar9;
          if (iVar10 < 1) {
            return 1;
          }
          iVar10 = 1;
          lVar22 = 0;
          while( true ) {
            iVar16 = *(int *)((long)&z->img_comp[0].h + lVar22);
            iVar20 = *(int *)((long)&z->img_comp[0].v + lVar22);
            *(uint *)((long)&z->img_comp[0].x + lVar22) = (iVar16 * sVar7 + (uVar6 - 1)) / uVar6;
            *(int *)((long)&z->img_comp[0].y + lVar22) = (int)((iVar20 * b + iVar8 + -1) / uVar15);
            iVar16 = iVar16 * uVar18;
            a = iVar16 * 8;
            *(int *)((long)&z->img_comp[0].w2 + lVar22) = a;
            iVar20 = iVar20 * uVar9;
            b_00 = iVar20 * 8;
            *(int *)((long)&z->img_comp[0].h2 + lVar22) = b_00;
            pvVar12 = stbi__malloc_mad2(a,b_00,0xf);
            puVar3 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar22);
            *puVar3 = 0;
            puVar3[1] = 0;
            *(undefined8 *)((long)&z->img_comp[0].coeff + lVar22) = 0;
            *(void **)((long)&z->img_comp[0].raw_data + lVar22) = pvVar12;
            why = extraout_EDX;
            if (pvVar12 == (void *)0x0) break;
            *(ulong *)((long)&z->img_comp[0].data + lVar22) =
                 (long)pvVar12 + 0xfU & 0xfffffffffffffff0;
            if (z->progressive != 0) {
              *(int *)((long)&z->img_comp[0].coeff_w + lVar22) = iVar16;
              *(int *)((long)&z->img_comp[0].coeff_h + lVar22) = iVar20;
              pvVar12 = stbi__malloc_mad3(a,b_00,2,0xf);
              *(void **)((long)&z->img_comp[0].raw_coeff + lVar22) = pvVar12;
              why = extraout_EDX_00;
              if (pvVar12 == (void *)0x0) break;
              *(ulong *)((long)&z->img_comp[0].coeff + lVar22) =
                   (long)pvVar12 + 0xfU & 0xfffffffffffffff0;
            }
            iVar10 = iVar10 + 1;
            lVar22 = lVar22 + 0x60;
            if (uVar19 * 0x60 == lVar22) {
              return 1;
            }
          }
          stbi__g_failure_reason = "outofmem";
          stbi__free_jpeg_components(z,iVar10,why);
          return 0;
        }
        goto LAB_001d269b;
      }
    }
    else if (s->read_from_callbacks != 0) {
      psVar11 = s->buffer_start;
      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar11,s->buflen);
      if (iVar10 == 0) {
        s->read_from_callbacks = 0;
        psVar13 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar5 = '\0';
      }
      else {
        psVar13 = psVar11 + iVar10;
        sVar5 = *psVar11;
      }
      s->img_buffer_end = psVar13;
      s->img_buffer = s->buffer_start + 1;
      goto LAB_001d271c;
    }
    stbi__g_failure_reason = "only 8-bit";
  }
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}